

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWOImporter::LoadLWO2File(LWOImporter *this)

{
  size_t *psVar1;
  _List_node_base **this_00;
  uint8_t *puVar2;
  uint uVar3;
  pointer pFVar4;
  pointer pFVar5;
  list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *this_01;
  _List_node_base *p_Var6;
  uint8_t *puVar7;
  pointer paVar8;
  pointer paVar9;
  _List_node_base *p_Var10;
  bool bVar11;
  ushort uVar12;
  int iVar13;
  uint *puVar14;
  _Node *p_Var15;
  long lVar16;
  Logger *pLVar17;
  runtime_error *prVar18;
  uint uVar19;
  char *message;
  uint *puVar21;
  bool bVar22;
  uint *puVar23;
  uint uVar24;
  char buffer [128];
  undefined1 local_188 [144];
  undefined **local_f8;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  uint local_d0;
  pointer local_c8;
  pointer pfStack_c0;
  pointer local_b8;
  _Bit_type *p_Stack_b0;
  uint local_a8;
  _Bit_type *local_a0;
  uint local_98;
  _Bit_pointer local_90;
  pointer local_88;
  pointer pFStack_80;
  pointer local_78;
  undefined8 uStack_70;
  uint16_t local_68;
  uint16_t local_66;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  ulong uVar20;
  
  if (7 < (ulong)this->fileSize) {
    puVar21 = (uint *)this->mFileBuffer;
    puVar23 = (uint *)((ulong)this->fileSize + (long)puVar21);
    puVar14 = puVar21 + 2;
    bVar22 = false;
    do {
      uVar24 = *puVar21;
      this->mFileBuffer = (uint8_t *)(puVar21 + 1);
      uVar3 = puVar21[1];
      this->mFileBuffer = (uint8_t *)puVar14;
      uVar19 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 |
               (uint)(((ulong)uVar24 << 0x20) >> 0x18) & 0xff0000 |
               (uint)(((ulong)uVar24 << 0x20) >> 8);
      uVar20 = ((ulong)uVar3 & 0xff000000) << 8 | ((ulong)uVar3 & 0xff0000) << 0x18 |
               ((ulong)uVar3 & 0xff00) << 0x28 | CONCAT44(uVar24,uVar3) << 0x38;
      puVar21 = (uint *)((long)puVar14 + (uVar20 >> 0x20));
      if (puVar23 < puVar21) {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_188._0_8_ = local_188 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_188,"LWO2: Chunk length points behind the file","");
        std::runtime_error::runtime_error(prVar18,(string *)local_188);
        *(undefined ***)prVar18 = &PTR__runtime_error_008e3168;
        __cxa_throw(prVar18,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (uVar20 >> 0x20 != 0) {
        uVar24 = (uint)(uVar20 >> 0x20);
        if ((int)uVar19 < 0x50544147) {
          if ((int)uVar19 < 0x4c415952) {
            if (uVar19 == 0x434c4950) {
              LoadLWO2Clip(this,uVar24);
            }
            else if (uVar19 == 0x454e564c) {
              LoadLWO2Envelope(this,uVar24);
            }
          }
          else if (uVar19 == 0x4c415952) {
            this_01 = this->mLayers;
            memset(local_188,0,0x90);
            local_f0._M_p = (pointer)&local_e0;
            local_e8 = 0;
            local_e0._M_local_buf[0] = '\0';
            local_d0 = 3;
            local_a0 = (_Bit_type *)0x0;
            local_98 = 0;
            local_90 = (_Bit_pointer)0x0;
            local_c8 = (pointer)0x0;
            pfStack_c0 = (pointer)0x0;
            local_b8 = (pointer)0x0;
            p_Stack_b0 = (_Bit_type *)0x0;
            local_a8 = 0;
            local_f8 = &PTR__VMapEntry_008edba8;
            local_78 = (pointer)0x0;
            uStack_70._0_4_ = 0;
            uStack_70._4_4_ = 0;
            local_88 = (pointer)0x0;
            pFStack_80 = (pointer)0x0;
            local_68 = 0;
            local_66 = 0xffff;
            local_60._M_p = (pointer)&local_50;
            local_58 = 0;
            local_50._M_local_buf[0] = '\0';
            local_40._0_5_ = 0;
            local_40._5_3_ = 0;
            local_40._8_4_ = 0.0;
            local_40[0xc] = false;
            p_Var15 = std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::
                      _M_create_node<Assimp::LWO::Layer>(this_01,(Layer *)local_188);
            std::__detail::_List_node_base::_M_hook(&p_Var15->super__List_node_base);
            psVar1 = &(this_01->
                      super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>).
                      _M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            LWO::Layer::~Layer((Layer *)local_188);
            p_Var6 = (this->mLayers->
                     super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>).
                     _M_impl._M_node.super__List_node_base._M_prev;
            this->mCurLayer = (Layer *)(p_Var6 + 1);
            if (uVar20 >> 0x24 == 0) {
              prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_188._0_8_ = local_188 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_188,"LWO: LAYR chunk is too small","");
              std::runtime_error::runtime_error(prVar18,(string *)local_188);
              *(undefined ***)prVar18 = &PTR__runtime_error_008e3168;
              __cxa_throw(prVar18,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar12 = *(ushort *)this->mFileBuffer;
            uVar12 = uVar12 << 8 | uVar12 >> 8;
            this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 2);
            *(ushort *)((long)&p_Var6[0x13]._M_next + 2) = uVar12;
            if ((this->configLayerIndex == 0xffffffff) ||
               (bVar11 = true, this->configLayerIndex - 1 == (uint)uVar12)) {
              bVar11 = false;
            }
            puVar7 = this->mFileBuffer;
            this->mFileBuffer = puVar7 + 2;
            uVar3 = *(uint *)(puVar7 + 2);
            this->mFileBuffer = puVar7 + 6;
            (this->mCurLayer->mPivot).x =
                 (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                        uVar3 << 0x18);
            uVar3 = *(uint *)this->mFileBuffer;
            this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
            (this->mCurLayer->mPivot).y =
                 (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                        uVar3 << 0x18);
            uVar3 = *(uint *)this->mFileBuffer;
            this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
            (this->mCurLayer->mPivot).z =
                 (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                        uVar3 << 0x18);
            puVar7 = this->mFileBuffer;
            if (*puVar7 != '\0') {
              lVar16 = 1;
              do {
                if (uVar24 - 0x10 < (uint)lVar16) {
                  pLVar17 = DefaultLogger::get();
                  Logger::warn(pLVar17,"LWO: Invalid file, string is is too long");
                  break;
                }
                this->mFileBuffer = puVar7 + lVar16;
                puVar2 = puVar7 + lVar16;
                lVar16 = lVar16 + 1;
              } while (*puVar2 != '\0');
            }
            this_00 = &p_Var6[0x13]._M_prev;
            puVar2 = this->mFileBuffer;
            local_188._0_8_ = local_188 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_188,puVar7,puVar2);
            std::__cxx11::string::operator=((string *)this_00,(string *)local_188);
            if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
              operator_delete((void *)local_188._0_8_,(ulong)((long)(float *)local_188._16_8_ + 1));
            }
            this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar2 - (int)puVar7 & 1));
            if (p_Var6[0x14]._M_next == (_List_node_base *)0x0) {
              snprintf(local_188,0x80,"Layer_%i");
              p_Var10 = p_Var6[0x14]._M_next;
              strlen(local_188);
              std::__cxx11::string::_M_replace((ulong)this_00,0,(char *)p_Var10,(ulong)local_188);
            }
            p_Var10 = (_List_node_base *)(this->configLayerName)._M_string_length;
            if ((p_Var10 == (_List_node_base *)0x0) ||
               ((bVar22 = true, p_Var10 == p_Var6[0x14]._M_next &&
                (iVar13 = bcmp((this->configLayerName)._M_dataplus._M_p,*this_00,(size_t)p_Var10),
                iVar13 == 0)))) {
              this->hasNamedLayer = true;
              bVar22 = bVar11;
            }
            puVar14 = (uint *)((long)this->mFileBuffer + 2);
            uVar12 = 0xffff;
            if (puVar14 <= puVar21) {
              uVar12 = *(ushort *)this->mFileBuffer;
              this->mFileBuffer = (uint8_t *)puVar14;
              uVar12 = uVar12 << 8 | uVar12 >> 8;
            }
            *(ushort *)&p_Var6[0x13]._M_next = uVar12;
            *(bool *)((long)&p_Var6[0x16]._M_next + 4) = bVar22;
          }
          else if (uVar19 == 0x504e5453) {
            if (!bVar22) {
              paVar8 = (this->mCurLayer->mTempPoints).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              paVar9 = (this->mCurLayer->mTempPoints).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              LoadLWOPoints(this,uVar24);
              this->mCurLayer->mPointIDXOfs =
                   (int)((ulong)((long)paVar8 - (long)paVar9) >> 2) * -0x55555555;
            }
          }
          else if ((uVar19 == 0x504f4c53) && (!bVar22)) {
            pFVar4 = (this->mCurLayer->mFaces).
                     super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pFVar5 = (this->mCurLayer->mFaces).
                     super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            LoadLWO2Polygons(this,uVar24);
            this->mCurLayer->mFaceIDXOfs = (uint)((ulong)((long)pFVar4 - (long)pFVar5) >> 5);
          }
        }
        else if ((int)uVar19 < 0x54414753) {
          if (uVar19 == 0x50544147) {
            if (!bVar22) {
              if ((this->mCurLayer->mFaces).
                  super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  (this->mCurLayer->mFaces).
                  super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                pLVar17 = DefaultLogger::get();
                message = "LWO2: Unexpected PTAG";
                goto LAB_004354c1;
              }
              LoadLWO2PolygonTags(this,uVar24);
            }
          }
          else if (uVar19 == 0x53555246) {
            LoadLWO2Surface(this,uVar24);
          }
        }
        else if (uVar19 == 0x54414753) {
          if ((this->mTags->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start ==
              (this->mTags->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            LoadLWOTags(this,uVar24);
          }
          else {
            pLVar17 = DefaultLogger::get();
            message = "LWO2: SRFS chunk encountered twice";
LAB_004354c1:
            Logger::warn(pLVar17,message);
          }
        }
        else {
          if (uVar19 == 0x564d4144) {
            if ((this->mCurLayer->mFaces).
                super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
                super__Vector_impl_data._M_start ==
                (this->mCurLayer->mFaces).
                super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pLVar17 = DefaultLogger::get();
              message = "LWO2: Unexpected VMAD chunk";
              goto LAB_004354c1;
            }
          }
          else if (uVar19 != 0x564d4150) goto LAB_00434f08;
          if (!bVar22) {
            if ((this->mCurLayer->mTempPoints).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start ==
                (this->mCurLayer->mTempPoints).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pLVar17 = DefaultLogger::get();
              message = "LWO2: Unexpected VMAP chunk";
              goto LAB_004354c1;
            }
            LoadLWO2VertexMap(this,uVar24,uVar19 == 0x564d4144);
          }
        }
      }
LAB_00434f08:
      this->mFileBuffer = (uint8_t *)puVar21;
      puVar14 = puVar21 + 2;
    } while (puVar14 <= puVar23);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2File()
{
    bool skip = false;

    LE_NCONST uint8_t* const end = mFileBuffer + fileSize;
    unsigned int iUnnamed = 0;
    while (true)
    {
        if (mFileBuffer + sizeof(IFF::ChunkHeader) > end)break;
        const IFF::ChunkHeader head = IFF::LoadChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
        {
            throw DeadlyImportError("LWO2: Chunk length points behind the file");
            break;
        }
        uint8_t* const next = mFileBuffer+head.length;

        if(!head.length) {
            mFileBuffer = next;
            continue;
        }

        switch (head.type)
        {
            // new layer
        case AI_LWO_LAYR:
            {
                // add a new layer to the list ....
                mLayers->push_back ( LWO::Layer() );
                LWO::Layer& layer = mLayers->back();
                mCurLayer = &layer;

                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,LAYR,16);

                // layer index.
                layer.mIndex = GetU2();

                // Continue loading this layer or ignore it? Check the layer index property
                if (UINT_MAX != configLayerIndex && (configLayerIndex-1) != layer.mIndex)   {
                    skip = true;
                }
                else skip = false;

                // pivot point
                mFileBuffer += 2; /* unknown */
                mCurLayer->mPivot.x = GetF4();
                mCurLayer->mPivot.y = GetF4();
                mCurLayer->mPivot.z = GetF4();
                GetS0(layer.mName,head.length-16);

                // if the name is empty, generate a default name
                if (layer.mName.empty())    {
                    char buffer[128]; // should be sufficiently large
                    ::ai_snprintf(buffer, 128, "Layer_%i", iUnnamed++);
                    layer.mName = buffer;
                }

                // load this layer or ignore it? Check the layer name property
                if (configLayerName.length() && configLayerName != layer.mName) {
                    skip = true;
                }
                else hasNamedLayer = true;

                // optional: parent of this layer
                if (mFileBuffer + 2 <= next)
                    layer.mParent = GetU2();
                else layer.mParent = -1;

                // Set layer skip parameter
                layer.skip = skip;

                break;
            }

            // vertex list
        case AI_LWO_PNTS:
            {
                if (skip)
                    break;

                unsigned int old = (unsigned int)mCurLayer->mTempPoints.size();
                LoadLWOPoints(head.length);
                mCurLayer->mPointIDXOfs = old;
                break;
            }
            // vertex tags
        case AI_LWO_VMAD:
            if (mCurLayer->mFaces.empty())
            {
                ASSIMP_LOG_WARN("LWO2: Unexpected VMAD chunk");
                break;
            }
            // --- intentionally no break here
        case AI_LWO_VMAP:
            {
                if (skip)
                    break;

                if (mCurLayer->mTempPoints.empty())
                    ASSIMP_LOG_WARN("LWO2: Unexpected VMAP chunk");
                else LoadLWO2VertexMap(head.length,head.type == AI_LWO_VMAD);
                break;
            }
            // face list
        case AI_LWO_POLS:
            {
                if (skip)
                    break;

                unsigned int old = (unsigned int)mCurLayer->mFaces.size();
                LoadLWO2Polygons(head.length);
                mCurLayer->mFaceIDXOfs = old;
                break;
            }
            // polygon tags
        case AI_LWO_PTAG:
            {
                if (skip)
                    break;

                if (mCurLayer->mFaces.empty()) {
                    ASSIMP_LOG_WARN("LWO2: Unexpected PTAG");
                } else {
                    LoadLWO2PolygonTags(head.length);
                }
                break;
            }
            // list of tags
        case AI_LWO_TAGS:
            {
                if (!mTags->empty()) {
                    ASSIMP_LOG_WARN("LWO2: SRFS chunk encountered twice");
                }   else {
                    LoadLWOTags(head.length);
                }
                break;
            }

            // surface chunk
        case AI_LWO_SURF:
            {
                LoadLWO2Surface(head.length);
                break;
            }

            // clip chunk
        case AI_LWO_CLIP:
            {
                LoadLWO2Clip(head.length);
                break;
            }

            // envelope chunk
        case AI_LWO_ENVL:
            {
                LoadLWO2Envelope(head.length);
                break;
            }
        }
        mFileBuffer = next;
    }
}